

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O0

uint * Kit_DsdTruthComputeOne(Kit_DsdMan_t *p,Kit_DsdNtk_t *pNtk,uint uSupp)

{
  int iVar1;
  uint *puVar2;
  uint *pIn;
  int local_2c;
  int i;
  uint *pTruthRes;
  uint uSupp_local;
  Kit_DsdNtk_t *pNtk_local;
  Kit_DsdMan_t *p_local;
  
  if (uSupp != 0) {
    Kit_DsdGetSupports(pNtk);
  }
  if ((int)(uint)pNtk->nVars <= p->nVars) {
    for (local_2c = 0; local_2c < (int)(uint)pNtk->nVars; local_2c = local_2c + 1) {
      puVar2 = (uint *)Vec_PtrEntry(p->vTtNodes,local_2c);
      pIn = (uint *)Vec_PtrEntry(p->vTtElems,local_2c);
      Kit_TruthCopy(puVar2,pIn,p->nVars);
    }
    iVar1 = Abc_Lit2Var((uint)pNtk->Root);
    puVar2 = Kit_DsdTruthComputeNodeOne_rec(p,pNtk,iVar1,uSupp);
    iVar1 = Abc_LitIsCompl((uint)pNtk->Root);
    if (iVar1 != 0) {
      Kit_TruthNot(puVar2,puVar2,(uint)pNtk->nVars);
    }
    return puVar2;
  }
  __assert_fail("pNtk->nVars <= p->nVars",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/kit/kitDsd.c"
                ,0x340,
                "unsigned int *Kit_DsdTruthComputeOne(Kit_DsdMan_t *, Kit_DsdNtk_t *, unsigned int)"
               );
}

Assistant:

unsigned * Kit_DsdTruthComputeOne( Kit_DsdMan_t * p, Kit_DsdNtk_t * pNtk, unsigned uSupp )
{
    unsigned * pTruthRes;
    int i;
    // if support is specified, request that supports are available
    if ( uSupp )
        Kit_DsdGetSupports( pNtk );
    // assign elementary truth tables
    assert( pNtk->nVars <= p->nVars );
    for ( i = 0; i < (int)pNtk->nVars; i++ )
        Kit_TruthCopy( (unsigned *)Vec_PtrEntry(p->vTtNodes, i), (unsigned *)Vec_PtrEntry(p->vTtElems, i), p->nVars );
    // compute truth table for each node
    pTruthRes = Kit_DsdTruthComputeNodeOne_rec( p, pNtk, Abc_Lit2Var(pNtk->Root), uSupp );
    // complement the truth table if needed
    if ( Abc_LitIsCompl(pNtk->Root) )
        Kit_TruthNot( pTruthRes, pTruthRes, pNtk->nVars );
    return pTruthRes;
}